

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_lib_destroy(void)

{
  block_s *blk;
  uint uVar1;
  anon_struct_32_4_90625080 *paVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  if (fio_data->is_worker == '\0') {
    bVar5 = false;
  }
  else {
    bVar5 = fio_data->workers != 1;
  }
  fio_data->active = '\0';
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  lVar3 = 0;
  do {
    fio_state_callback_clear((callback_type_e)lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  fio_defer_perform();
  lVar3 = 0;
  do {
    if (*(int *)((long)evio_fd + lVar3) != -1) {
      close(*(int *)((long)evio_fd + lVar3));
      *(undefined4 *)((long)evio_fd + lVar3) = 0xffffffff;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fio_free(fio_data);
  if (arenas != (arena_s *)0x0) {
    if (memory.cores != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        blk = *(block_s **)((long)&arenas->block + lVar3);
        if (blk != (block_s *)0x0) {
          block_free(blk);
        }
        *(undefined8 *)((long)&arenas->block + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < memory.cores);
    }
    if ((memory.forked == '\0') && ((anon_struct_32_4_90625080 *)memory.available.next != &memory))
    {
      if (2 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "WARNING: facil.io detected memory traces remaining after cleanup - memory leak?"
                      );
      }
      lVar3 = 0;
      for (paVar2 = (anon_struct_32_4_90625080 *)memory.available.next; paVar2 != &memory;
          paVar2 = (anon_struct_32_4_90625080 *)(paVar2->available).next) {
        lVar3 = lVar3 + 1;
      }
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:7328): Memory blocks in pool: %zu (%zu blocks per allocation)."
                       ,lVar3,0x100);
      }
    }
    munmap(arenas + -1,(size_t)arenas[-1].block);
    arenas = (arena_s *)0x0;
  }
  if (4 < FIO_LOG_LEVEL) {
    uVar1 = getpid();
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3537): (%d) facil.io resources released, exit complete."
                   ,(ulong)uVar1);
  }
  if (bVar5) {
    return;
  }
  fputc(10,_stderr);
  return;
}

Assistant:

static void __attribute__((destructor)) fio_lib_destroy(void) {
  uint8_t add_eol = fio_is_master();
  fio_data->active = 0;
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  fio_state_callback_clear_all();
  fio_defer_perform();
  fio_poll_close();
  fio_free(fio_data);
  /* memory library destruction must be last */
  fio_mem_destroy();
  FIO_LOG_DEBUG("(%d) facil.io resources released, exit complete.",
                (int)getpid());
  if (add_eol)
    fprintf(stderr, "\n"); /* add EOL to logs (logging adds EOL before text */
}